

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O1

void tabosc4_tilde_set(t_tabosc4_tilde *x,t_symbol *s)

{
  int iVar1;
  undefined8 in_RAX;
  _garray *x_00;
  char *pcVar2;
  int n;
  char *fmt;
  int pointsinarray;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  x->x_arrayname = s;
  x_00 = (_garray *)pd_findbyclass(s,garray_class);
  if (x_00 == (_garray *)0x0) {
    if (*s->s_name == '\0') goto LAB_00118e50;
    pcVar2 = x->x_arrayname->s_name;
    fmt = "tabosc4~: %s: no such array";
  }
  else {
    iVar1 = garray_getfloatwords(x_00,(int *)&local_24,&x->x_vec);
    if (iVar1 != 0) {
      n = local_24 - 3;
      iVar1 = ilog2(n);
      if (n == 1 << ((byte)iVar1 & 0x1f)) {
        x->x_fnpoints = (float)n;
        x->x_finvnpoints = 1.0 / (float)n;
      }
      else {
        pd_error(x,"%s: number of points (%d) not a power of 2 plus three",x->x_arrayname->s_name,
                 (ulong)local_24);
        x->x_vec = (t_word *)0x0;
      }
      garray_usedindsp(x_00);
      return;
    }
    pcVar2 = x->x_arrayname->s_name;
    fmt = "%s: bad template for tabosc4~";
  }
  pd_error(x,fmt,pcVar2);
LAB_00118e50:
  x->x_vec = (t_word *)0x0;
  return;
}

Assistant:

static void tabosc4_tilde_set(t_tabosc4_tilde *x, t_symbol *s)
{
    t_garray *a;
    int npoints, pointsinarray;

    x->x_arrayname = s;
    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
    {
        if (*s->s_name)
            pd_error(x, "tabosc4~: %s: no such array", x->x_arrayname->s_name);
        x->x_vec = 0;
    }
    else if (!garray_getfloatwords(a, &pointsinarray, &x->x_vec))
    {
        pd_error(x, "%s: bad template for tabosc4~", x->x_arrayname->s_name);
        x->x_vec = 0;
    }
    else if ((npoints = pointsinarray - 3) != (1 << ilog2(pointsinarray - 3)))
    {
        pd_error(x, "%s: number of points (%d) not a power of 2 plus three",
            x->x_arrayname->s_name, pointsinarray);
        x->x_vec = 0;
        garray_usedindsp(a);
    }
    else
    {
        x->x_fnpoints = npoints;
        x->x_finvnpoints = 1./npoints;
        garray_usedindsp(a);
    }
}